

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.cc
# Opt level: O2

void print_buffer(Pl_Buffer *bp)

{
  Buffer *this;
  uchar *puVar1;
  size_t sVar2;
  ostream *poVar3;
  char *pcVar4;
  int in_R8D;
  size_t sVar5;
  string local_50;
  
  (*(bp->super_Pipeline)._vptr_Pipeline[3])();
  this = Pl_Buffer::getBuffer(bp);
  puVar1 = Buffer::getBuffer(this);
  sVar2 = Buffer::getSize(this);
  for (sVar5 = 0; sVar2 != sVar5; sVar5 = sVar5 + 1) {
    QUtil::uint_to_string_base_abi_cxx11_(&local_50,(QUtil *)(ulong)puVar1[sVar5],0x10,2,in_R8D);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_50);
    pcVar4 = " ";
    if (sVar2 - 1 == sVar5) {
      pcVar4 = "\n";
    }
    std::operator<<(poVar3,pcVar4);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  Buffer::~Buffer(this);
  operator_delete(this,8);
  return;
}

Assistant:

static void
print_buffer(Pl_Buffer* bp)
{
    bp->finish();
    Buffer* b = bp->getBuffer();
    unsigned char const* p = b->getBuffer();
    size_t l = b->getSize();
    for (unsigned long i = 0; i < l; ++i) {
        std::cout << QUtil::uint_to_string_base(p[i], 16, 2) << ((i == l - 1) ? "\n" : " ");
    }
    std::cout << std::endl;
    delete b;
}